

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

void __thiscall wasm::WasmBinaryWriter::writeGlobals(WasmBinaryWriter *this)

{
  Type *this_00;
  ImportInfo *pIVar1;
  pointer puVar2;
  Global *pGVar3;
  size_t sVar4;
  pointer puVar5;
  Type *pTVar6;
  Module *__n;
  pointer __n_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  void *__buf_00;
  Expression *curr;
  iterator __end2;
  int iVar7;
  iterator __begin2;
  pointer puVar8;
  ulong uVar9;
  Iterator local_48;
  int32_t local_38;
  LEB<unsigned_int,_unsigned_char> local_34;
  
  pIVar1 = (this->importInfo)._M_t.
           super___uniq_ptr_impl<wasm::ImportInfo,_std::default_delete<wasm::ImportInfo>_>._M_t.
           super__Tuple_impl<0UL,_wasm::ImportInfo_*,_std::default_delete<wasm::ImportInfo>_>.
           super__Head_base<0UL,_wasm::ImportInfo_*,_false>._M_head_impl;
  __n = pIVar1->wasm;
  if ((int)((ulong)((long)*(pointer *)((long)&__n->globals + 8) -
                   *(long *)&(__n->globals).
                             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                   ) >> 3) !=
      (int)((ulong)((long)*(pointer *)
                           ((long)&(pIVar1->importedGlobals).
                                   super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>
                           + 8) -
                   *(long *)&(pIVar1->importedGlobals).
                             super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
                             _M_impl) >> 3)) {
    local_38 = startSection<wasm::BinaryConsts::Section>(this,Global);
    puVar2 = (this->wasm->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    iVar7 = 0;
    __buf = extraout_RDX;
    for (puVar8 = (this->wasm->globals).
                  super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar2; puVar8 = puVar8 + 1)
    {
      pGVar3 = (puVar8->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar3->super_Importable).module + 8) == (char *)0x0) {
        sVar4 = wasm::Type::size(&pGVar3->type);
        iVar7 = iVar7 + (int)sVar4;
        __buf = extraout_RDX_00;
      }
    }
    local_48.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)CONCAT44(local_48.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                          ._4_4_,iVar7);
    LEB<unsigned_int,_unsigned_char>::write
              ((LEB<unsigned_int,_unsigned_char> *)&local_48,(int)this->o,__buf,(size_t)__n);
    puVar2 = (this->wasm->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar8 = (this->wasm->globals).
                  super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar2; puVar8 = puVar8 + 1)
    {
      pGVar3 = (puVar8->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar3->super_Importable).module + 8) == (char *)0x0) {
        this_00 = &pGVar3->type;
        local_48.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
        __n_00 = puVar8;
        local_48.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             this_00;
        puVar5 = (pointer)wasm::Type::size(this_00);
        if (puVar5 != (pointer)0x0) {
          uVar9 = 0;
          do {
            pTVar6 = wasm::Type::Iterator::operator*(&local_48);
            writeType(this,(Type)pTVar6->id);
            local_34.value = (uint)pGVar3->mutable_;
            LEB<unsigned_int,_unsigned_char>::write(&local_34,(int)this->o,__buf_00,(size_t)__n_00);
            sVar4 = wasm::Type::size(this_00);
            curr = pGVar3->init;
            if (sVar4 != 1) {
              if (curr->_id != TupleMakeId) {
                handle_unreachable("unsupported tuple global operation",
                                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp"
                                   ,0x252);
              }
              if (curr[1].type.id <= uVar9) {
                __assert_fail("index < usedElements",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                              ,0xbc,
                              "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                             );
              }
              curr = *(Expression **)(*(long *)(curr + 1) + uVar9 * 8);
            }
            writeExpression(this,curr);
            local_34.value._0_1_ = 0xb;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                       (uchar *)&local_34);
            uVar9 = uVar9 + 1;
            __n_00 = (pointer)((long)&(((__uniq_ptr_data<wasm::Global,_std::default_delete<wasm::Global>,_true,_true>
                                         *)local_48.
                                           super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                           .index)->
                                      super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                                      )._M_t.
                                      super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                                      .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl + 1
                              );
            local_48.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
                 (size_t)__n_00;
          } while ((__n_00 != puVar5) ||
                  (local_48.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                   parent != this_00));
        }
      }
    }
    finishSection(this,local_38);
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeGlobals() {
  if (importInfo->getNumDefinedGlobals() == 0) {
    return;
  }
  auto start = startSection(BinaryConsts::Section::Global);
  // Count and emit the total number of globals after tuple globals have been
  // expanded into their constituent parts.
  Index num = 0;
  ModuleUtils::iterDefinedGlobals(
    *wasm, [&num](Global* global) { num += global->type.size(); });
  o << U32LEB(num);
  ModuleUtils::iterDefinedGlobals(*wasm, [&](Global* global) {
    size_t i = 0;
    for (const auto& t : global->type) {
      writeType(t);
      o << U32LEB(global->mutable_);
      if (global->type.size() == 1) {
        writeExpression(global->init);
      } else if (auto* make = global->init->dynCast<TupleMake>()) {
        // Emit the proper lane for this global.
        writeExpression(make->operands[i]);
      } else {
        // For now tuple globals must contain tuple.make. We could perhaps
        // support more operations, like global.get, but the code would need to
        // look something like this:
        //
        //   auto parentIndex = getGlobalIndex(get->name);
        //   o << int8_t(BinaryConsts::GlobalGet) << U32LEB(parentIndex + i);
        //
        // That is, we must emit the instruction here, and not defer to
        // writeExpression, as writeExpression writes an entire expression at a
        // time (and not just one of the lanes). As emitting an instruction here
        // is less clean, and there is no important use case for global.get of
        // one tuple global to another, we disallow this.
        WASM_UNREACHABLE("unsupported tuple global operation");
      }
      o << int8_t(BinaryConsts::End);
      ++i;
    }
  });
  finishSection(start);
}